

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O3

int cupdlp_dcs_sprealloc(cupdlp_dcs *A,int nzmax)

{
  int *piVar1;
  int *piVar2;
  double *pdVar3;
  ulong uVar4;
  double *__ptr;
  int *piVar5;
  bool bVar6;
  
  if (A == (cupdlp_dcs *)0x0) {
    return 0;
  }
  if ((nzmax < 1) && (nzmax = A->nz, nzmax == 0xffffffff)) {
    nzmax = A->p[A->n];
  }
  uVar4 = 1;
  if (1 < nzmax) {
    uVar4 = (ulong)(uint)nzmax;
  }
  piVar5 = A->i;
  piVar1 = (int *)realloc(piVar5,uVar4 * 4);
  if (piVar1 != (int *)0x0) {
    piVar5 = piVar1;
  }
  A->i = piVar5;
  if (A->nz < 0) {
    bVar6 = true;
  }
  else {
    piVar5 = A->p;
    piVar2 = (int *)realloc(piVar5,uVar4 * 4);
    bVar6 = piVar2 != (int *)0x0;
    if (bVar6) {
      piVar5 = piVar2;
    }
    A->p = piVar5;
  }
  __ptr = A->x;
  if (__ptr == (double *)0x0) {
    if ((bool)(bVar6 ^ 1U | piVar1 == (int *)0x0)) {
      return 0;
    }
  }
  else {
    pdVar3 = (double *)realloc(__ptr,uVar4 * 8);
    if (pdVar3 != (double *)0x0) {
      __ptr = pdVar3;
    }
    A->x = __ptr;
    if (pdVar3 == (double *)0x0) {
      return 0;
    }
    if (!(bool)(piVar1 != (int *)0x0 & bVar6)) {
      return 0;
    }
  }
  A->nzmax = (int)uVar4;
  return 1;
}

Assistant:

int cupdlp_dcs_sprealloc(cupdlp_dcs *A, int nzmax) {
  int ok, oki, okj = 1, okx = 1;
  if (!A) return (0);
  if (nzmax <= 0) nzmax = IS_CSC(A) ? (A->p[A->n]) : A->nz;
  nzmax = MAX(nzmax, 1);
  A->i = cupdlp_dcs_realloc(A->i, nzmax, sizeof(int), &oki);
  if (IS_TRIPLET(A)) A->p = cupdlp_dcs_realloc(A->p, nzmax, sizeof(int), &okj);
  if (A->x) A->x = cupdlp_dcs_realloc(A->x, nzmax, sizeof(double), &okx);
  ok = (oki && okj && okx);
  if (ok) A->nzmax = nzmax;
  return (ok);
}